

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RenderingVenue.cpp
# Opt level: O2

bool __thiscall soul::RenderingVenue::Pimpl::createSession(Pimpl *this,SessionReadyCallback *cb)

{
  _Manager_type p_Var1;
  TaskFunction TStack_58;
  anon_class_40_2_28a14680 local_38;
  
  local_38.callback.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_38.callback.super__Function_base._M_functor._8_8_ = 0;
  local_38.callback.super__Function_base._M_manager = (_Manager_type)0x0;
  local_38.callback._M_invoker = cb->_M_invoker;
  p_Var1 = (cb->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_38.callback.super__Function_base._M_functor._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(cb->super__Function_base)._M_functor;
    local_38.callback.super__Function_base._M_functor._8_8_ =
         *(undefined8 *)((long)&(cb->super__Function_base)._M_functor + 8);
    (cb->super__Function_base)._M_manager = (_Manager_type)0x0;
    cb->_M_invoker = (_Invoker_type)0x0;
    local_38.callback.super__Function_base._M_manager = p_Var1;
  }
  local_38.this = this;
  std::function<void(std::atomic<int>&)>::
  function<soul::RenderingVenue::Pimpl::createSession(std::function<void(std::unique_ptr<soul::Venue::Session,std::default_delete<soul::Venue::Session>>)>)::_lambda(std::atomic<int>&)_1_,void>
            ((function<void(std::atomic<int>&)> *)&TStack_58,&local_38);
  TaskThread::Queue::addTask(&this->createSessionQueue,&TStack_58);
  std::_Function_base::~_Function_base(&TStack_58.super__Function_base);
  std::_Function_base::~_Function_base(&local_38.callback.super__Function_base);
  return true;
}

Assistant:

bool createSession (SessionReadyCallback cb)
    {
        createSessionQueue.addTask ([this, callback = std::move (cb)] (TaskThread::ShouldStopFlag&)
        {
            callback (std::make_unique<Pimpl::SessionImpl> (*this, performerFactory->createPerformer()));
        });

        return true;
    }